

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O1

void __thiscall
iu_FooP_x_iutest_x_DISABLED_Bar_Test::Body(iu_FooP_x_iutest_x_DISABLED_Bar_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParamType PVar2;
  ParamType *pPVar3;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  pPVar3 = iutest::WithParamInterface<int>::GetParam();
  PVar2 = *pPVar3;
  memset((iuStreamMessage *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = PVar2;
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(int *)&local_1d0);
  paVar1 = &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2;
  local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Failed.\n","");
  local_1d0.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/disabled_tests_decl.cpp"
  ;
  local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x38;
  local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
  iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  return;
}

Assistant:

IUTEST_P(FooP, DISABLED_Bar)
{
    int v = GetParam();
    IUTEST_FAIL() << v;
}